

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

KOption getoption(Header *h,char **fmt,int *size)

{
  byte bVar1;
  int iVar2;
  KOption KVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)*fmt;
  *fmt = (char *)(pbVar4 + 1);
  bVar1 = *pbVar4;
  *size = 0;
  if (bVar1 < 0x54) {
    switch(bVar1) {
    case 0x3c:
    case 0x3d:
      h->islittle = 1;
      return Knop;
    case 0x3e:
      h->islittle = 0;
      return Knop;
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x4b:
      goto switchD_0011dfd5_caseD_3f;
    case 0x42:
      *size = 1;
      break;
    case 0x48:
      *size = 2;
      break;
    case 0x49:
      iVar2 = getnumlimit(h,fmt,4);
      *size = iVar2;
      break;
    case 0x4a:
    case 0x4c:
switchD_0011dfd5_caseD_4a:
      *size = 8;
      return Kuint;
    default:
      if (bVar1 == 0x20) {
        return Knop;
      }
      if (bVar1 == 0x21) {
        iVar2 = getnumlimit(h,fmt,8);
        h->maxalign = iVar2;
        return Knop;
      }
      goto switchD_0011dfd5_caseD_3f;
    }
    return Kuint;
  }
  switch(bVar1) {
  case 0x62:
    *size = 1;
    goto LAB_0011e102;
  case 99:
    if ((int)(char)pbVar4[1] - 0x3aU < 0xfffffff6) {
      *size = -1;
    }
    else {
      pbVar4 = pbVar4 + 2;
      iVar2 = 0;
      do {
        *fmt = (char *)pbVar4;
        iVar2 = (char)pbVar4[-1] + -0x30 + iVar2 * 10;
        if (9 < (int)(char)*pbVar4 - 0x30U) break;
        pbVar4 = pbVar4 + 1;
      } while (iVar2 < 0xccccccc);
      *size = iVar2;
      if (iVar2 != -1) {
        return Kchar;
      }
    }
    luaL_error(h->L,"missing size for format option \'c\'");
    KVar3 = Kchar;
    break;
  case 100:
  case 0x6e:
    *size = 8;
    goto LAB_0011e10d;
  case 0x65:
  case 0x67:
  case 0x6b:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x79:
    goto switchD_0011dfd5_caseD_3f;
  case 0x66:
    *size = 4;
LAB_0011e10d:
    KVar3 = Kfloat;
    break;
  case 0x68:
    *size = 2;
    goto LAB_0011e102;
  case 0x69:
    iVar2 = getnumlimit(h,fmt,4);
    *size = iVar2;
    goto LAB_0011e102;
  case 0x6a:
  case 0x6c:
    *size = 8;
LAB_0011e102:
    KVar3 = Kint;
    break;
  case 0x73:
    iVar2 = getnumlimit(h,fmt,8);
    *size = iVar2;
    KVar3 = Kstring;
    break;
  case 0x78:
    *size = 1;
    KVar3 = Kpadding;
    break;
  case 0x7a:
    KVar3 = Kzstr;
    break;
  default:
    if (bVar1 == 0x54) goto switchD_0011dfd5_caseD_4a;
    if (bVar1 == 0x58) {
      return Kpaddalign;
    }
    goto switchD_0011dfd5_caseD_3f;
  }
  return KVar3;
switchD_0011dfd5_caseD_3f:
  luaL_error(h->L,"invalid format option \'%c\'",(ulong)(uint)(int)(char)bVar1);
  return Knop;
}

Assistant:

static KOption getoption (Header *h, const char **fmt, int *size) {
  int opt = *((*fmt)++);
  *size = 0;  /* default */
  switch (opt) {
    case 'b': *size = sizeof(char); return Kint;
    case 'B': *size = sizeof(char); return Kuint;
    case 'h': *size = sizeof(short); return Kint;
    case 'H': *size = sizeof(short); return Kuint;
    case 'l': *size = sizeof(long); return Kint;
    case 'L': *size = sizeof(long); return Kuint;
    case 'j': *size = sizeof(lua_Integer); return Kint;
    case 'J': *size = sizeof(lua_Integer); return Kuint;
    case 'T': *size = sizeof(size_t); return Kuint;
    case 'f': *size = sizeof(float); return Kfloat;
    case 'd': *size = sizeof(double); return Kfloat;
    case 'n': *size = sizeof(lua_Number); return Kfloat;
    case 'i': *size = getnumlimit(h, fmt, sizeof(int)); return Kint;
    case 'I': *size = getnumlimit(h, fmt, sizeof(int)); return Kuint;
    case 's': *size = getnumlimit(h, fmt, sizeof(size_t)); return Kstring;
    case 'c':
      *size = getnum(fmt, -1);
      if (*size == -1)
        luaL_error(h->L, "missing size for format option 'c'");
      return Kchar;
    case 'z': return Kzstr;
    case 'x': *size = 1; return Kpadding;
    case 'X': return Kpaddalign;
    case ' ': break;
    case '<': h->islittle = 1; break;
    case '>': h->islittle = 0; break;
    case '=': h->islittle = nativeendian.little; break;
    case '!': h->maxalign = getnumlimit(h, fmt, MAXALIGN); break;
    default: luaL_error(h->L, "invalid format option '%c'", opt);
  }
  return Knop;
}